

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

__pid_t __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::wait
          (thread_pool<(unsigned_char)__x00_> *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> tasks_lock;
  mutex_type *in_stack_ffffffffffffffb8;
  condition_variable *this_00;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffd0;
  condition_variable local_18 [16];
  thread_pool<(unsigned_char)__x00_> *local_8;
  
  this_00 = local_18;
  local_8 = this;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)this,in_stack_ffffffffffffffb8);
  this->waiting = true;
  std::condition_variable::wait<BS::thread_pool<(unsigned_char)0>::wait()::_lambda()_1_>
            (this_00,(unique_lock<std::mutex> *)this,in_stack_ffffffffffffffd0);
  this->waiting = false;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this);
  return extraout_EAX;
}

Assistant:

void wait()
    {
#ifdef __cpp_exceptions
        if constexpr (wait_deadlock_checks_enabled)
        {
            if (this_thread::get_pool() == this)
                throw wait_deadlock();
        }
#endif
        std::unique_lock tasks_lock(tasks_mutex);
        waiting = true;
        tasks_done_cv.wait(tasks_lock,
            [this]
            {
                if constexpr (pause_enabled)
                    return (tasks_running == 0) && (paused || tasks.empty());
                else
                    return (tasks_running == 0) && tasks.empty();
            });
        waiting = false;
    }